

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spgmr_serial.c
# Opt level: O2

int ATimes(void *Data,N_Vector v_vec,N_Vector z_vec)

{
  long lVar1;
  int iVar2;
  realtype *flagvalue;
  realtype *flagvalue_00;
  realtype *flagvalue_01;
  realtype *flagvalue_02;
  long lVar3;
  int iVar4;
  
  flagvalue = N_VGetArrayPointer(v_vec);
  iVar2 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  iVar4 = 1;
  if (iVar2 == 0) {
    flagvalue_00 = N_VGetArrayPointer(z_vec);
    iVar2 = check_flag(flagvalue_00,"N_VGetArrayPointer",0);
    if (iVar2 == 0) {
      flagvalue_01 = N_VGetArrayPointer(*(N_Vector *)((long)Data + 0x10));
      iVar2 = check_flag(flagvalue_01,"N_VGetArrayPointer",0);
      if (iVar2 == 0) {
        flagvalue_02 = N_VGetArrayPointer(*(N_Vector *)((long)Data + 0x18));
        iVar2 = check_flag(flagvalue_02,"N_VGetArrayPointer",0);
        if (iVar2 == 0) {
          lVar1 = *Data;
          *flagvalue_00 =
               (*flagvalue * 5.0 * *flagvalue_02 - flagvalue_02[1] * flagvalue[1]) / *flagvalue_01;
          for (lVar3 = 1; lVar3 < lVar1 + -1; lVar3 = lVar3 + 1) {
            flagvalue_00[lVar3] =
                 ((flagvalue[lVar3] * 5.0 * flagvalue_02[lVar3] -
                  flagvalue[lVar3 + -1] * flagvalue_02[lVar3 + -1]) -
                 flagvalue[lVar3 + 1] * flagvalue_02[lVar3 + 1]) / flagvalue_01[lVar3];
          }
          flagvalue_00[lVar1 + -1] =
               (flagvalue[lVar1 + -1] * 5.0 * flagvalue_02[lVar1 + -1] -
               flagvalue[lVar1 + -2] * flagvalue_02[lVar1 + -2]) / flagvalue_01[lVar1 + -1];
          iVar4 = 0;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int ATimes(void* Data, N_Vector v_vec, N_Vector z_vec)
{
  /* local variables */
  realtype *v, *z, *s1, *s2;
  sunindextype i, N;
  UserData *ProbData;
  
  /* access user data structure and vector data */
  ProbData = (UserData *) Data;
  v = N_VGetArrayPointer(v_vec);
  if (check_flag(v, "N_VGetArrayPointer", 0)) return 1;
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) return 1;
  s1 = N_VGetArrayPointer(ProbData->s1);
  if (check_flag(s1, "N_VGetArrayPointer", 0)) return 1;
  s2 = N_VGetArrayPointer(ProbData->s2);
  if (check_flag(s2, "N_VGetArrayPointer", 0)) return 1;
  N = ProbData->N;

  /* perform product at the left domain boundary (note: v is zero at the boundary)*/
  z[0] = (FIVE*v[0]*s2[0] - v[1]*s2[1])/s1[0];
    
  /* iterate through interior of local domain, performing product */
  for (i=1; i<N-1; i++) 
    z[i] = (-v[i-1]*s2[i-1] + FIVE*v[i]*s2[i] - v[i+1]*s2[i+1])/s1[i];

  /* perform product at the right domain boundary (note: v is zero at the boundary)*/ 
  z[N-1] = (-v[N-2]*s2[N-2] + FIVE*v[N-1]*s2[N-1])/s1[N-1];
  
  /* return with success */
  return 0;
}